

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O0

void duckdb_scalar_function_set_extra_info
               (duckdb_scalar_function function,void *extra_info,duckdb_delete_callback_t destroy)

{
  ScalarFunction *this;
  CScalarFunctionInfo *pCVar1;
  duckdb_delete_callback_t in_RDX;
  duckdb_function_info in_RSI;
  duckdb_scalar_function in_RDI;
  CScalarFunctionInfo *info;
  ScalarFunction *scalar_function;
  
  if ((in_RDI != (duckdb_scalar_function)0x0) && (in_RSI != (duckdb_function_info)0x0)) {
    this = duckdb::GetCScalarFunction(in_RDI);
    duckdb::shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator->
              ((shared_ptr<duckdb::ScalarFunctionInfo,_true> *)this);
    pCVar1 = duckdb::ScalarFunctionInfo::Cast<duckdb::CScalarFunctionInfo>
                       ((ScalarFunctionInfo *)this);
    pCVar1->extra_info = in_RSI;
    pCVar1->delete_callback = in_RDX;
  }
  return;
}

Assistant:

void duckdb_scalar_function_set_extra_info(duckdb_scalar_function function, void *extra_info,
                                           duckdb_delete_callback_t destroy) {
	if (!function || !extra_info) {
		return;
	}
	auto &scalar_function = GetCScalarFunction(function);
	auto &info = scalar_function.function_info->Cast<duckdb::CScalarFunctionInfo>();
	info.extra_info = reinterpret_cast<duckdb_function_info>(extra_info);
	info.delete_callback = destroy;
}